

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

int ctemplate_htmlparser::HtmlparserCppTest::UpdateColumns(string *str,int column)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = std::__cxx11::string::rfind((char)str,10);
  iVar1 = (int)str->_M_string_length;
  iVar2 = column + iVar1 + 9;
  if (lVar3 != -1) {
    iVar2 = (iVar1 - (int)lVar3) + 2;
  }
  return iVar2;
}

Assistant:

int HtmlparserCppTest::UpdateColumns(const string &str, int column) {
  // Number of bytes since the last newline.
  size_t last_newline = str.rfind('\n');

  // If no newline was found, we just sum up all the characters in the
  // annotation.
  if (last_newline == string::npos) {
    return static_cast<int>(column + str.size() +
                            strlen(kDirectiveBegin) + strlen(kDirectiveEnd));
  // If a newline was found, the new column count becomes the number of
  // characters after the last newline.
  } else {
    return static_cast<int>(str.size() + strlen(kDirectiveEnd) - last_newline);
  }
}